

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O2

void __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::add
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,Name *h,DataKey *info)

{
  int iVar1;
  pointer pEVar2;
  int iVar3;
  
  if ((double)(int)(((long)(this->m_elem).data.
                           super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_elem).data.
                          super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) * 0.7 <=
      (double)this->m_used) {
    reMax(this,(int)((double)this->m_used * this->m_memfactor) + 1,0);
  }
  iVar1 = (*this->m_hashfun)(h);
  pEVar2 = (this->m_elem).data.
           super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    iVar3 = iVar1 % (int)(((long)(this->m_elem).data.
                                 super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2) / 0x18);
    iVar1 = iVar3 + this->m_hashsize;
  } while (*(states *)((long)(pEVar2 + iVar3) + 0x10) == USED);
  *(states *)((long)(pEVar2 + iVar3) + 0x10) = USED;
  *(DataKey *)((long)(pEVar2 + iVar3) + 8) = *info;
  pEVar2 = (this->m_elem).data.
           super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start + iVar3;
  if (pEVar2 != (pointer)h) {
    (pEVar2->item).name = h->name;
  }
  this->m_used = this->m_used + 1;
  return;
}

Assistant:

void add(const HashItem& h, const Info& info)
   {
      assert(!has(h));

      if(m_used >= m_elem.size() * SOPLEX_HASHTABLE_FILLFACTOR)
         reMax(int(m_memfactor * m_used) + 1);

      assert(m_used < m_elem.size());

      decltype(m_elem.size()) i;

      for(i = (*m_hashfun)(&h) % m_elem.size();
            m_elem[i].stat == Elem::USED;
            i = (i + m_hashsize) % m_elem.size())
         ;

      assert(m_elem[i].stat != Elem::USED);

      m_elem[i].stat = Elem::USED;
      m_elem[i].info = info;
      m_elem[i].item = h;

      m_used++;

      assert(has(h));
   }